

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<int>(int *first,int *last,int *x)

{
  int iVar1;
  
  switch((uint)((int)last - (int)first) >> 2 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_001169ae:
      *first = iVar1;
      first = first + 1;
switchD_0011698f_caseD_6:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_001169bc:
      *first = iVar1;
      first = first + 1;
switchD_0011698f_caseD_4:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_001169ca:
      *first = iVar1;
      first = first + 1;
switchD_0011698f_caseD_2:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_001169d8:
      *first = iVar1;
    }
    break;
  case 1:
    iVar1 = *x;
    goto LAB_001169d8;
  case 2:
    goto switchD_0011698f_caseD_2;
  case 3:
    iVar1 = *x;
    goto LAB_001169ca;
  case 4:
    goto switchD_0011698f_caseD_4;
  case 5:
    iVar1 = *x;
    goto LAB_001169bc;
  case 6:
    goto switchD_0011698f_caseD_6;
  case 7:
    iVar1 = *x;
    goto LAB_001169ae;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}